

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButton::timerEvent(QAbstractButton *this,QTimerEvent *e)

{
  QAbstractButtonPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  if (*(TimerId *)(e + 0x10) == (this_00->repeatTimer).m_id) {
    QBasicTimer::start(&this_00->repeatTimer,this_00->autoRepeatInterval,(QObject *)this);
    if ((this_00->field_0x28c & 0x10) != 0) {
      local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      QPointer<QAbstractButton>::QPointer<void>((QPointer<QAbstractButton> *)&local_38,this);
      (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this);
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
      if (bVar1) {
        QAbstractButtonPrivate::emitReleased(this_00);
      }
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
      if (bVar1) {
        QAbstractButtonPrivate::emitClicked(this_00);
      }
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
      if (bVar1) {
        QAbstractButtonPrivate::emitPressed(this_00);
      }
      QWeakPointer<QObject>::~QWeakPointer(&local_38);
    }
  }
  else if (*(TimerId *)(e + 0x10) == (this_00->animateTimer).m_id) {
    QBasicTimer::stop();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QAbstractButtonPrivate::click(this_00);
      return;
    }
    goto LAB_0039c86f;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0039c86f:
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::timerEvent(QTimerEvent *e)
{
    Q_D(QAbstractButton);
    if (e->timerId() == d->repeatTimer.timerId()) {
        d->repeatTimer.start(d->autoRepeatInterval, this);
        if (d->down) {
            QPointer<QAbstractButton> guard(this);
            nextCheckState();
            if (guard)
                d->emitReleased();
            if (guard)
                d->emitClicked();
            if (guard)
                d->emitPressed();
        }
    } else if (e->timerId() == d->animateTimer.timerId()) {
        d->animateTimer.stop();
        d->click();
    }
}